

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCex.c
# Opt level: O0

Abc_Cex_t * Gia_ManCexExtendToIncludeAllObjects(Gia_Man_t *p,Abc_Cex_t *pCex)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Abc_Cex_t *pAVar6;
  Gia_Obj_t *pGVar7;
  bool bVar8;
  int local_44;
  int local_40;
  int iBit;
  int k;
  int i;
  Gia_Obj_t *pObjRi;
  Gia_Obj_t *pObjRo;
  Gia_Obj_t *pObj;
  Abc_Cex_t *pNew;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *p_local;
  
  local_44 = 0;
  if (pCex->nRegs < 1) {
    __assert_fail("pCex->nRegs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCex.c"
                  ,0x166,"Abc_Cex_t *Gia_ManCexExtendToIncludeAllObjects(Gia_Man_t *, Abc_Cex_t *)")
    ;
  }
  iVar3 = Gia_ManObjNum(p);
  pAVar6 = Abc_CexAlloc(0,iVar3,pCex->iFrame + 1);
  pAVar6->iFrame = pCex->iFrame;
  pAVar6->iPo = pCex->iPo;
  pGVar7 = Gia_ManConst0(p);
  *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xffffffffbfffffff;
  local_40 = 0;
  while( true ) {
    iVar3 = Gia_ManRegNum(p);
    bVar8 = false;
    if (local_40 < iVar3) {
      iVar3 = Gia_ManPoNum(p);
      _k = Gia_ManCo(p,iVar3 + local_40);
      bVar8 = _k != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    uVar5 = Abc_InfoHasBit((uint *)(pCex + 1),local_44);
    *(ulong *)_k = *(ulong *)_k & 0xffffffffbfffffff | ((ulong)uVar5 & 1) << 0x1e;
    local_40 = local_40 + 1;
    local_44 = local_44 + 1;
  }
  if (local_44 != pCex->nRegs) {
    __assert_fail("iBit == pCex->nRegs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCex.c"
                  ,0x170,"Abc_Cex_t *Gia_ManCexExtendToIncludeAllObjects(Gia_Man_t *, Abc_Cex_t *)")
    ;
  }
  for (iBit = 0; iBit <= pCex->iFrame; iBit = iBit + 1) {
    local_40 = 0;
    while( true ) {
      iVar3 = Gia_ManPiNum(p);
      bVar8 = false;
      if (local_40 < iVar3) {
        pObjRo = Gia_ManCi(p,local_40);
        bVar8 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      uVar5 = Abc_InfoHasBit((uint *)(pCex + 1),local_44);
      *(ulong *)pObjRo = *(ulong *)pObjRo & 0xffffffffbfffffff | ((ulong)uVar5 & 1) << 0x1e;
      local_40 = local_40 + 1;
      local_44 = local_44 + 1;
    }
    local_40 = 0;
    while( true ) {
      iVar3 = Gia_ManRegNum(p);
      bVar8 = false;
      if (local_40 < iVar3) {
        iVar3 = Gia_ManPoNum(p);
        _k = Gia_ManCo(p,iVar3 + local_40);
        bVar8 = false;
        if (_k != (Gia_Obj_t *)0x0) {
          iVar3 = Gia_ManPiNum(p);
          pObjRi = Gia_ManCi(p,iVar3 + local_40);
          bVar8 = pObjRi != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar8) break;
      *(ulong *)pObjRi =
           *(ulong *)pObjRi & 0xffffffffbfffffff | (ulong)((uint)(*(ulong *)_k >> 0x1e) & 1) << 0x1e
      ;
      local_40 = local_40 + 1;
    }
    local_40 = 0;
    while( true ) {
      bVar8 = false;
      if (local_40 < p->nObjs) {
        pObjRo = Gia_ManObj(p,local_40);
        bVar8 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      if ((*(ulong *)pObjRo >> 0x1e & 1) != 0) {
        Abc_InfoSetBit((uint *)(pAVar6 + 1),pAVar6->nPis * iBit + local_40);
      }
      local_40 = local_40 + 1;
    }
    local_40 = 0;
    while( true ) {
      bVar8 = false;
      if (local_40 < p->nObjs) {
        pObjRo = Gia_ManObj(p,local_40);
        bVar8 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      iVar3 = Gia_ObjIsAnd(pObjRo);
      if (iVar3 != 0) {
        pGVar7 = Gia_ObjFanin0(pObjRo);
        uVar2 = *(ulong *)pGVar7;
        uVar5 = Gia_ObjFaninC0(pObjRo);
        pGVar7 = Gia_ObjFanin1(pObjRo);
        uVar1 = *(ulong *)pGVar7;
        uVar4 = Gia_ObjFaninC1(pObjRo);
        *(ulong *)pObjRo =
             *(ulong *)pObjRo & 0xffffffffbfffffff |
             ((ulong)(((uint)(uVar2 >> 0x1e) & 1 ^ uVar5) & ((uint)(uVar1 >> 0x1e) & 1 ^ uVar4)) & 1
             ) << 0x1e;
      }
      local_40 = local_40 + 1;
    }
    local_40 = 0;
    while( true ) {
      iVar3 = Vec_IntSize(p->vCos);
      bVar8 = false;
      if (local_40 < iVar3) {
        pObjRo = Gia_ManCo(p,local_40);
        bVar8 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      pGVar7 = Gia_ObjFanin0(pObjRo);
      uVar2 = *(ulong *)pGVar7;
      uVar5 = Gia_ObjFaninC0(pObjRo);
      *(ulong *)pObjRo =
           *(ulong *)pObjRo & 0xffffffffbfffffff |
           ((ulong)((uint)(uVar2 >> 0x1e) & 1 ^ uVar5) & 1) << 0x1e;
      local_40 = local_40 + 1;
    }
  }
  if (local_44 != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCex.c"
                  ,0x17f,"Abc_Cex_t *Gia_ManCexExtendToIncludeAllObjects(Gia_Man_t *, Abc_Cex_t *)")
    ;
  }
  pGVar7 = Gia_ManPo(p,pCex->iPo);
  if (((uint)(*(ulong *)pGVar7 >> 0x1e) & 1) != 1) {
    __assert_fail("Gia_ManPo(p, pCex->iPo)->fMark0 == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCex.c"
                  ,0x180,"Abc_Cex_t *Gia_ManCexExtendToIncludeAllObjects(Gia_Man_t *, Abc_Cex_t *)")
    ;
  }
  Gia_ManCleanMark0(p);
  return pAVar6;
}

Assistant:

Abc_Cex_t * Gia_ManCexExtendToIncludeAllObjects( Gia_Man_t * p, Abc_Cex_t * pCex )
{
    Abc_Cex_t * pNew;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int i, k, iBit = 0;
    assert( pCex->nRegs > 0 );
    // start the counter-example
    pNew = Abc_CexAlloc( 0, Gia_ManObjNum(p), pCex->iFrame + 1 );
    pNew->iFrame = pCex->iFrame;
    pNew->iPo    = pCex->iPo;
    // set const0
    Gia_ManConst0(p)->fMark0 = 0;
    // set init state
    Gia_ManForEachRi( p, pObjRi, k )
        pObjRi->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
    assert( iBit == pCex->nRegs );
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
        Gia_ManForEachObj( p, pObj, k )
            if ( pObj->fMark0 )
                Abc_InfoSetBit( pNew->pData, pNew->nPis * i + k );
        Gia_ManForEachAnd( p, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( p, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
    }
    assert( iBit == pCex->nBits );
    assert( Gia_ManPo(p, pCex->iPo)->fMark0 == 1 );
    Gia_ManCleanMark0(p);
    return pNew;
}